

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
::prepare_insert(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
                 *this,size_t hashval)

{
  size_t sVar1;
  T TVar2;
  ctrl_t *pcVar3;
  FindInfo FVar4;
  
  FVar4 = find_first_non_full(this,hashval);
  sVar1 = FVar4.offset;
  pcVar3 = this->ctrl_;
  TVar2 = (this->settings_).
          super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
          .
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>,_0UL,_false>
          .value;
  if (TVar2 == 0) {
    if (pcVar3[sVar1] == -2) {
      TVar2 = 0;
    }
    else {
      rehash_and_grow_if_necessary(this);
      FVar4 = find_first_non_full(this,hashval);
      sVar1 = FVar4.offset;
      pcVar3 = this->ctrl_;
      TVar2 = (this->settings_).
              super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              .
              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>,_0UL,_false>
              .value;
    }
  }
  this->size_ = this->size_ + 1;
  (this->settings_).
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>,_0UL,_false>
  .value = TVar2 - (pcVar3[sVar1] == -0x80);
  return sVar1;
}

Assistant:

size_t prepare_insert(size_t hashval) PHMAP_ATTRIBUTE_NOINLINE {
				auto target = find_first_non_full(hashval);
				if (PHMAP_PREDICT_FALSE(growth_left() == 0 &&
				                        !IsDeleted(ctrl_[target.offset])))
				{
					rehash_and_grow_if_necessary();
					target = find_first_non_full(hashval);
				}
				++size_;
				growth_left() -= IsEmpty(ctrl_[target.offset]);
				// set_ctrl(target.offset, H2(hashval));
				infoz_.RecordInsert(hashval, target.probe_length);
				return target.offset;
			}